

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::StartLayer
          (S2Builder *this,
          unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *layer)

{
  pointer pLVar1;
  size_type sVar2;
  IsFullPolygonPredicate local_50;
  value_type_conflict1 local_30;
  value_type local_2c;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *local_18;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *layer_local;
  S2Builder *this_local;
  
  local_18 = layer;
  layer_local = (unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)this;
  pLVar1 = std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::operator->
                     (layer);
  (*pLVar1->_vptr_Layer[2])();
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::push_back
            (&this->layer_options_,&local_2c);
  sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->input_edges_);
  local_30 = (value_type_conflict1)sVar2;
  std::vector<int,_std::allocator<int>_>::push_back(&this->layer_begins_,&local_30);
  IsFullPolygon(&local_50,false);
  std::
  vector<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>,_std::allocator<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>_>_>
  ::push_back(&this->layer_is_full_polygon_predicates_,&local_50);
  std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::~function(&local_50);
  std::
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  ::push_back(&this->layers_,layer);
  return;
}

Assistant:

void S2Builder::StartLayer(unique_ptr<Layer> layer) {
  layer_options_.push_back(layer->graph_options());
  layer_begins_.push_back(input_edges_.size());
  layer_is_full_polygon_predicates_.push_back(IsFullPolygon(false));
  layers_.push_back(std::move(layer));
}